

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void VerticalPred_SSE2(uint8_t *dst,uint8_t *top,int size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  
  if (top != (uint8_t *)0x0) {
    if (size == 8) {
      uVar1 = *(undefined8 *)top;
      for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 0x20) {
        *(undefined8 *)(dst + lVar3) = uVar1;
      }
    }
    else {
      uVar1 = *(undefined8 *)top;
      uVar2 = *(undefined8 *)(top + 8);
      for (lVar3 = 0; lVar3 != 0x200; lVar3 = lVar3 + 0x20) {
        *(undefined8 *)(dst + lVar3) = uVar1;
        *(undefined8 *)(dst + lVar3 + 8) = uVar2;
      }
    }
    return;
  }
  Fill_SSE2(dst,0x7f,size);
  return;
}

Assistant:

static WEBP_INLINE void VerticalPred_SSE2(uint8_t* WEBP_RESTRICT dst,
                                          const uint8_t* WEBP_RESTRICT top,
                                          int size) {
  if (top != NULL) {
    if (size == 8) {
      VE8uv_SSE2(dst, top);
    } else {
      VE16_SSE2(dst, top);
    }
  } else {
    Fill_SSE2(dst, 127, size);
  }
}